

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O1

xmlChar * xmlC11NNormalizeString(xmlChar *input,xmlC14NNormalizationMode mode)

{
  xmlChar xVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  int iVar4;
  xmlChar *pxVar5;
  long lVar6;
  
  if (input != (xmlChar *)0x0) {
    pxVar2 = (xmlChar *)(*xmlMallocAtomic)(1000);
    if (pxVar2 != (xmlChar *)0x0) {
      pxVar3 = pxVar2;
      if (*input != '\0') {
        pxVar5 = input + 1;
        iVar4 = 1000;
        do {
          lVar6 = (long)pxVar2 - (long)pxVar3;
          if (iVar4 + -10 < lVar6) {
            iVar4 = iVar4 * 2;
            pxVar3 = (xmlChar *)(*xmlRealloc)(pxVar3,(long)iVar4);
            if (pxVar3 == (xmlChar *)0x0) {
              xmlC14NErrMemory("growing buffer");
              return (xmlChar *)0x0;
            }
            pxVar2 = pxVar3 + (int)lVar6;
          }
          xVar1 = pxVar5[-1];
          if ((xVar1 == '<') &&
             ((mode == XMLC14N_NORMALIZE_TEXT || (mode == XMLC14N_NORMALIZE_ATTR)))) {
            builtin_memcpy(pxVar2,"&lt;",4);
LAB_00138989:
            pxVar2 = pxVar2 + 4;
          }
          else {
            if (xVar1 == '>' && mode == XMLC14N_NORMALIZE_TEXT) {
              builtin_memcpy(pxVar2,"&gt;",4);
              goto LAB_00138989;
            }
            if ((xVar1 == '&') &&
               ((mode == XMLC14N_NORMALIZE_TEXT || (mode == XMLC14N_NORMALIZE_ATTR)))) {
              builtin_memcpy(pxVar2,"&amp",4);
LAB_00138a14:
              pxVar2[4] = ';';
              pxVar2 = pxVar2 + 5;
            }
            else {
              if (xVar1 != '\"' || mode != XMLC14N_NORMALIZE_ATTR) {
                if (xVar1 == '\t' && mode == XMLC14N_NORMALIZE_ATTR) {
                  builtin_memcpy(pxVar2,"&#x9",4);
                }
                else if (xVar1 == '\n' && mode == XMLC14N_NORMALIZE_ATTR) {
                  builtin_memcpy(pxVar2,"&#xA",4);
                }
                else {
                  if (xVar1 != '\r' || XMLC14N_NORMALIZE_TEXT < mode) {
                    *pxVar2 = xVar1;
                    pxVar2 = pxVar2 + 1;
                    goto LAB_00138a1e;
                  }
                  builtin_memcpy(pxVar2,"&#xD",4);
                }
                goto LAB_00138a14;
              }
              builtin_memcpy(pxVar2,"&quot;",6);
              pxVar2 = pxVar2 + 6;
            }
          }
LAB_00138a1e:
          xVar1 = *pxVar5;
          pxVar5 = pxVar5 + 1;
        } while (xVar1 != '\0');
      }
      *pxVar2 = '\0';
      return pxVar3;
    }
    xmlC14NErrMemory("allocating buffer");
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlC11NNormalizeString(const xmlChar * input,
                       xmlC14NNormalizationMode mode)
{
    const xmlChar *cur = input;
    xmlChar *buffer = NULL;
    xmlChar *out = NULL;
    int buffer_size = 0;

    if (input == NULL)
        return (NULL);

    /*
     * allocate an translation buffer.
     */
    buffer_size = 1000;
    buffer = (xmlChar *) xmlMallocAtomic(buffer_size);
    if (buffer == NULL) {
	xmlC14NErrMemory("allocating buffer");
        return (NULL);
    }
    out = buffer;

    while (*cur != '\0') {
        if ((out - buffer) > (buffer_size - 10)) {
            int indx = out - buffer;

            growBufferReentrant();
            out = &buffer[indx];
        }

        if ((*cur == '<') && ((mode == XMLC14N_NORMALIZE_ATTR) ||
                              (mode == XMLC14N_NORMALIZE_TEXT))) {
            *out++ = '&';
            *out++ = 'l';
            *out++ = 't';
            *out++ = ';';
        } else if ((*cur == '>') && (mode == XMLC14N_NORMALIZE_TEXT)) {
            *out++ = '&';
            *out++ = 'g';
            *out++ = 't';
            *out++ = ';';
        } else if ((*cur == '&') && ((mode == XMLC14N_NORMALIZE_ATTR) ||
                                     (mode == XMLC14N_NORMALIZE_TEXT))) {
            *out++ = '&';
            *out++ = 'a';
            *out++ = 'm';
            *out++ = 'p';
            *out++ = ';';
        } else if ((*cur == '"') && (mode == XMLC14N_NORMALIZE_ATTR)) {
            *out++ = '&';
            *out++ = 'q';
            *out++ = 'u';
            *out++ = 'o';
            *out++ = 't';
            *out++ = ';';
        } else if ((*cur == '\x09') && (mode == XMLC14N_NORMALIZE_ATTR)) {
            *out++ = '&';
            *out++ = '#';
            *out++ = 'x';
            *out++ = '9';
            *out++ = ';';
        } else if ((*cur == '\x0A') && (mode == XMLC14N_NORMALIZE_ATTR)) {
            *out++ = '&';
            *out++ = '#';
            *out++ = 'x';
            *out++ = 'A';
            *out++ = ';';
        } else if ((*cur == '\x0D') && ((mode == XMLC14N_NORMALIZE_ATTR) ||
                                        (mode == XMLC14N_NORMALIZE_TEXT) ||
                                        (mode == XMLC14N_NORMALIZE_COMMENT) ||
					(mode == XMLC14N_NORMALIZE_PI))) {
            *out++ = '&';
            *out++ = '#';
            *out++ = 'x';
            *out++ = 'D';
            *out++ = ';';
        } else {
            /*
             * Works because on UTF-8, all extended sequences cannot
             * result in bytes in the ASCII range.
             */
            *out++ = *cur;
        }
        cur++;
    }
    *out = 0;
    return (buffer);
}